

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void getChildItem(string *path)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  dir_block *pdVar5;
  string *local_db8;
  string *local_d38;
  int local_d2c;
  int i;
  dir_block *p;
  string local_d18 [4];
  int blocks;
  undefined4 local_cf4;
  string local_cf0 [48];
  string local_cc0 [36];
  int local_c9c;
  string local_c98 [4];
  int layers;
  string asStack_18 [4];
  int local_14;
  string *psStack_10;
  int cur_inode;
  string *path_local;
  
  local_d38 = local_c98;
  psStack_10 = path;
  do {
    std::__cxx11::string::string(local_d38);
    local_d38 = local_d38 + 0x20;
  } while (local_d38 != asStack_18);
  std::__cxx11::string::string(local_cc0,(string *)path);
  iVar1 = parsePath((string *)local_cc0,(string *)local_c98);
  std::__cxx11::string::~string(local_cc0);
  local_c9c = iVar1;
  std::__cxx11::string::string(local_cf0,(string *)path);
  iVar2 = getPathType((string *)local_cf0);
  iVar3 = doesExist((string *)local_c98,iVar1,iVar2 == 2);
  iVar1 = local_c9c;
  std::__cxx11::string::~string(local_cf0);
  iVar2 = local_c9c;
  if (iVar3 == iVar1) {
    std::__cxx11::string::string(local_d18,(string *)path);
    iVar1 = getPathType((string *)local_d18);
    local_14 = getId((string *)local_c98,iVar2,iVar1 == 2);
    std::__cxx11::string::~string(local_d18);
    pdVar5 = getAddressByLocation_Folder(inodes[local_14].i_blocks[0]);
    for (local_d2c = 0; local_d2c < 0x10; local_d2c = local_d2c + 1) {
      iVar1 = strcmp(pdVar5->dirs[local_d2c].name,"");
      if (iVar1 != 0) {
        if (inodes[pdVar5->dirs[local_d2c].inode_id].i_mode == 1) {
          setColor(1);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,pdVar5->dirs[local_d2c].name);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,inodes[pdVar5->dirs[local_d2c].inode_id].i_file_size);
        poVar4 = std::operator<<(poVar4,"B");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        setColor(2);
      }
    }
    local_cf4 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)path);
    std::operator<<(poVar4,": No such file or directory.\n");
    local_cf4 = 1;
  }
  local_db8 = asStack_18;
  do {
    local_db8 = local_db8 + -0x20;
    std::__cxx11::string::~string(local_db8);
  } while (local_db8 != local_c98);
  return;
}

Assistant:

void getChildItem(string path) {
    int cur_inode;
    string names[100];
    int layers = parsePath(path, names);
    if (doesExist(names, layers, getPathType(path) == RELATIVE_PATH) != layers) {
        cout << path << ": No such file or directory.\n";
        return;
    }
    cur_inode = getId(names, layers, getPathType(path) == RELATIVE_PATH);
    int blocks = inodes[cur_inode].i_blocks[0];
    dir_block *p = getAddressByLocation_Folder(blocks);
    for (int i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "") != 0)//非空
        {
            if (inodes[p->dirs[i].inode_id].i_mode == A_FOLDER)
            {
                setColor(COLOR_FOLDER);
            }
            cout << p->dirs[i].name << "\t" << inodes[p->dirs[i].inode_id].i_file_size << "B" << endl;
            setColor(COLOR_ORIGIN);
        }
    }
}